

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O3

ByteList * __thiscall
XCryptionCommon::algorithm3_3
          (ByteList *__return_storage_ptr__,XCryptionCommon *this,uint inRevision,uint inLength,
          ByteList *inOwnerPassword,ByteList *inUserPassword)

{
  byte bVar1;
  ulong uVar2;
  MD5Generator *pMVar3;
  _List_node_base *p_Var4;
  XCryptionCommon *pXVar5;
  XCryptionCommon *pXVar6;
  MD5Generator *pMVar7;
  ByteList *pBVar8;
  _List_node_base *p_Var9;
  undefined4 in_register_0000000c;
  LongBufferSizeType inLength_00;
  byte bVar10;
  int iVar11;
  XCryptionCommon *pXVar12;
  _Alloc_hider _Var13;
  ByteList *hashResult;
  ByteList userPassword32Chars;
  ByteList ownerPassword32Chars;
  ByteList RC4Key;
  MD5Generator md5;
  undefined1 local_228 [56];
  ByteList local_1f0;
  MD5Generator local_1d8;
  undefined1 local_110 [24];
  MD5Generator local_f8;
  
  local_228._24_8_ = CONCAT44(in_register_0000000c,inLength);
  substr((ByteList *)(local_110 + 0x18),inOwnerPassword,0,0x20);
  uVar2 = (inOwnerPassword->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
          ._M_node._M_size;
  if (uVar2 < 0x20) {
    substr((ByteList *)&local_1d8,&this->mPaddingFiller,0,0x20 - uVar2);
  }
  else {
    local_1d8.MD5FinalHexString._M_dataplus._M_p = (pointer)&local_1d8;
    local_1d8.MD5FinalHexString.field_2._M_allocated_capacity = 0;
    local_1d8.MD5FinalHexString._M_string_length =
         (size_type)local_1d8.MD5FinalHexString._M_dataplus._M_p;
  }
  add(&local_1f0,(ByteList *)(local_110 + 0x18),(ByteList *)&local_1d8);
  _Var13._M_p = local_1d8.MD5FinalHexString._M_dataplus._M_p;
  while (p_Var9 = (_List_node_base *)local_f8.MD5FinalHexString._M_dataplus._M_p,
        (MD5Generator *)_Var13._M_p != &local_1d8) {
    pMVar3 = (MD5Generator *)
             (((_List_impl *)&(((MD5Generator *)_Var13._M_p)->MD5FinalHexString)._M_dataplus)->
             _M_node).super__List_node_base._M_next;
    operator_delete(_Var13._M_p,0x18);
    _Var13._M_p = (pointer)pMVar3;
  }
  while (p_Var9 != (_List_node_base *)(local_110 + 0x18)) {
    p_Var4 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var9->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9,0x18);
    p_Var9 = p_Var4;
  }
  substr((ByteList *)(local_110 + 0x18),inUserPassword,0,0x20);
  uVar2 = (inUserPassword->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          _M_node._M_size;
  if (uVar2 < 0x20) {
    substr((ByteList *)&local_1d8,&this->mPaddingFiller,0,0x20 - uVar2);
  }
  else {
    local_1d8.MD5FinalHexString.field_2._M_allocated_capacity = 0;
    local_1d8.MD5FinalHexString._M_dataplus._M_p = (pointer)&local_1d8;
    local_1d8.MD5FinalHexString._M_string_length = (size_type)&local_1d8;
  }
  add((ByteList *)(local_228 + 0x20),(ByteList *)(local_110 + 0x18),(ByteList *)&local_1d8);
  _Var13._M_p = local_1d8.MD5FinalHexString._M_dataplus._M_p;
  while ((MD5Generator *)_Var13._M_p != &local_1d8) {
    pMVar3 = (MD5Generator *)(((MD5Generator *)_Var13._M_p)->MD5FinalHexString)._M_dataplus._M_p;
    operator_delete(_Var13._M_p,0x18);
    _Var13._M_p = (pointer)pMVar3;
  }
  while ((_List_node_base *)local_f8.MD5FinalHexString._M_dataplus._M_p !=
         (_List_node_base *)(local_110 + 0x18)) {
    p_Var9 = ((_List_node_base *)local_f8.MD5FinalHexString._M_dataplus._M_p)->_M_next;
    operator_delete(local_f8.MD5FinalHexString._M_dataplus._M_p,0x18);
    local_f8.MD5FinalHexString._M_dataplus._M_p = (pointer)p_Var9;
  }
  MD5Generator::MD5Generator((MD5Generator *)(local_110 + 0x18));
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node._M_size = 0;
  MD5Generator::Accumulate((MD5Generator *)(local_110 + 0x18),&local_1f0);
  pBVar8 = MD5Generator::ToString_abi_cxx11_((MD5Generator *)(local_110 + 0x18));
  if (pBVar8 != __return_storage_ptr__) {
    std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>::
    _M_assign_dispatch<std::_List_const_iterator<unsigned_char>>
              ((list<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (pBVar8->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               _M_node.super__List_node_base._M_next,pBVar8);
  }
  if (2 < inRevision) {
    iVar11 = 0x32;
    do {
      MD5Generator::MD5Generator(&local_1d8);
      MD5Generator::Accumulate(&local_1d8,__return_storage_ptr__);
      pBVar8 = MD5Generator::ToString_abi_cxx11_(&local_1d8);
      if (pBVar8 != __return_storage_ptr__) {
        std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_dispatch<std::_List_const_iterator<unsigned_char>>
                  ((list<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (pBVar8->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   ._M_node.super__List_node_base._M_next,pBVar8);
      }
      MD5Generator::~MD5Generator(&local_1d8);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  inLength_00 = local_228._24_8_ & 0xffffffff;
  if (inRevision == 2) {
    inLength_00 = 5;
  }
  pXVar12 = (XCryptionCommon *)__return_storage_ptr__;
  substr((ByteList *)&local_1d8,__return_storage_ptr__,0,inLength_00);
  RC4Encode((ByteList *)local_228,pXVar12,(ByteList *)&local_1d8,(ByteList *)(local_228 + 0x20));
  pXVar12 = (XCryptionCommon *)local_228;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__);
  pXVar6 = (XCryptionCommon *)local_228._0_8_;
  while (pXVar6 != (XCryptionCommon *)local_228) {
    pXVar5 = (XCryptionCommon *)
             (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
              &pXVar6->_vptr_XCryptionCommon)->_M_impl)._M_node.super__List_node_base._M_next;
    pXVar12 = (XCryptionCommon *)0x18;
    operator_delete(pXVar6,0x18);
    pXVar6 = pXVar5;
  }
  pMVar3 = (MD5Generator *)local_1d8.MD5FinalHexString._M_dataplus._M_p;
  if (2 < inRevision) {
    bVar10 = 1;
    do {
      local_228._16_8_ = (_List_node_base *)0x0;
      local_228._0_8_ = (XCryptionCommon *)local_228;
      local_228._8_8_ = (XCryptionCommon *)local_228;
      for (_Var13._M_p = local_1d8.MD5FinalHexString._M_dataplus._M_p;
          (MD5Generator *)_Var13._M_p != &local_1d8;
          _Var13._M_p = (((MD5Generator *)_Var13._M_p)->MD5FinalHexString)._M_dataplus._M_p) {
        bVar1 = (((MD5Generator *)_Var13._M_p)->MD5FinalHexString).field_2._M_local_buf[0];
        p_Var9 = (_List_node_base *)operator_new(0x18);
        *(byte *)&p_Var9[1]._M_next = bVar1 ^ bVar10;
        pXVar12 = (XCryptionCommon *)local_228;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_228._16_8_ = (long)(_List_node_base **)local_228._16_8_ + 1;
      }
      RC4Encode((ByteList *)local_110,pXVar12,(ByteList *)local_228,__return_storage_ptr__);
      pXVar12 = (XCryptionCommon *)local_110;
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (__return_storage_ptr__);
      pXVar6 = (XCryptionCommon *)local_110._0_8_;
      while (pXVar5 = (XCryptionCommon *)local_228._0_8_, pXVar6 != (XCryptionCommon *)local_110) {
        pXVar5 = (XCryptionCommon *)
                 (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                  &pXVar6->_vptr_XCryptionCommon)->_M_impl)._M_node.super__List_node_base._M_next;
        pXVar12 = (XCryptionCommon *)0x18;
        operator_delete(pXVar6,0x18);
        pXVar6 = pXVar5;
      }
      while (pXVar5 != (XCryptionCommon *)local_228) {
        pXVar6 = (XCryptionCommon *)pXVar5->_vptr_XCryptionCommon;
        pXVar12 = (XCryptionCommon *)0x18;
        operator_delete(pXVar5,0x18);
        pXVar5 = pXVar6;
      }
      bVar10 = bVar10 + 1;
      pMVar3 = (MD5Generator *)local_1d8.MD5FinalHexString._M_dataplus._M_p;
    } while (bVar10 != 0x14);
  }
  while (pMVar3 != &local_1d8) {
    pMVar7 = (MD5Generator *)(pMVar3->MD5FinalHexString)._M_dataplus._M_p;
    operator_delete(pMVar3,0x18);
    pMVar3 = pMVar7;
  }
  MD5Generator::~MD5Generator((MD5Generator *)(local_110 + 0x18));
  while ((_List_node_base *)local_228._32_8_ != (_List_node_base *)(local_228 + 0x20)) {
    p_Var9 = ((_List_node_base *)local_228._32_8_)->_M_next;
    operator_delete((void *)local_228._32_8_,0x18);
    local_228._32_8_ = p_Var9;
  }
  while (local_1f0.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_1f0) {
    p_Var9 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
              &(local_1f0.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_1f0.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl._M_node.super__List_node_base._M_next,0x18);
    local_1f0.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var9;
  }
  return __return_storage_ptr__;
}

Assistant:

ByteList XCryptionCommon::algorithm3_3(unsigned int inRevision,
	unsigned int inLength,
	const ByteList& inOwnerPassword,
	const ByteList& inUserPassword) {
	ByteList ownerPassword32Chars = add(substr(inOwnerPassword, 0, 32), (inOwnerPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inOwnerPassword.size()) : ByteList()));
	ByteList userPassword32Chars = add(substr(inUserPassword, 0, 32), (inUserPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inUserPassword.size()) : ByteList()));
	MD5Generator md5;
	ByteList hashResult;

	md5.Accumulate(ownerPassword32Chars);

	hashResult = md5.ToString();

	if (inRevision >= 3) {
		for (int i = 0; i < 50; ++i) {
			MD5Generator anotherMD5;
			anotherMD5.Accumulate(hashResult);
			hashResult = anotherMD5.ToString();
		}
	}

	ByteList RC4Key = (inRevision == 2 ? substr(hashResult, 0, 5) : substr(hashResult, 0, inLength));

	hashResult = RC4Encode(RC4Key, userPassword32Chars);

	if (inRevision >= 3) {
		for (Byte i = 1; i <= 19; ++i) {
			ByteList newRC4Key;
			ByteList::iterator it = RC4Key.begin();
			for (; it != RC4Key.end(); ++it)
				newRC4Key.push_back((*it) ^ i);
			hashResult = RC4Encode(newRC4Key, hashResult);
		}
	}

	return hashResult;
}